

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O2

Symbols * Preprocessor::macroExpandIdentifier
                    (Symbols *__return_storage_ptr__,Preprocessor *that,SymbolStack *symbols,
                    int lineNum,QByteArray *macroName)

{
  SafeSymbols *pSVar1;
  QVLAStorage<24UL,_8UL,_5LL> *pQVar2;
  Data *pDVar3;
  Data *pDVar4;
  bool bVar5;
  bool bVar6;
  Token TVar7;
  iterator iVar8;
  qsizetype qVar9;
  bool bVar10;
  long lVar11;
  char *pcVar12;
  char cVar13;
  int iVar14;
  int iVar15;
  Symbol *pSVar16;
  Symbol *sym;
  Symbol *this;
  long in_FS_OFFSET;
  QByteArrayView after;
  QArrayDataPointer<char> local_228;
  QArrayDataPointer<char> local_210;
  Symbol local_1f8;
  QArrayDataPointer<char> local_1c8;
  qsizetype idx;
  QArrayDataPointer<char> QStack_1a0;
  qsizetype local_188;
  qsizetype qStack_180;
  Symbol next;
  QArrayDataPointer<Symbol> local_148;
  Macro local_130;
  Symbol s;
  QVarLengthArray<QList<Symbol>,_5LL> local_c8;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  s.from = -0x5555555555555556;
  s.len = -0x5555555555555556;
  s.lex.d.ptr = (char *)0xaaaaaaaaaaaaaaaa;
  s.lex.d.size = -0x5555555555555556;
  s.lineNum = -0x55555556;
  s.token = 0xaaaaaaaa;
  s.lex.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  pSVar1 = (symbols->super_QStack<SafeSymbols>).super_QList<SafeSymbols>.d.ptr;
  lVar11 = (symbols->super_QStack<SafeSymbols>).super_QList<SafeSymbols>.d.size;
  Symbol::Symbol(&s,pSVar1[lVar11 + -1].symbols.d.ptr + pSVar1[lVar11 + -1].index + -1);
  if (s.token == IDENTIFIER) {
    Symbol::operator_cast_to_SubArray((SubArray *)&local_c8,&s);
    bVar5 = QHash<SubArray,_Macro>::contains(&that->macros,(SubArray *)&local_c8);
    if (bVar5) {
      Symbol::lexem((QByteArray *)&local_130,&s);
      bVar5 = SymbolStack::dontReplaceSymbol(symbols,(QByteArray *)&local_130);
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_130);
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_c8);
      if (!bVar5) {
        Symbol::operator_cast_to_SubArray((SubArray *)&local_c8,&s);
        QHash<SubArray,_Macro>::value(&local_130,&that->macros,(SubArray *)&local_c8);
        QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_c8);
        Symbol::lexem((QByteArray *)&local_c8,&s);
        pDVar3 = (macroName->d).d;
        pcVar12 = (macroName->d).ptr;
        (macroName->d).d = (Data *)local_c8.super_QVLABase<QList<Symbol>_>.super_QVLABaseBase.a;
        (macroName->d).ptr = (char *)local_c8.super_QVLABase<QList<Symbol>_>.super_QVLABaseBase.s;
        pQVar2 = (QVLAStorage<24UL,_8UL,_5LL> *)(macroName->d).size;
        (macroName->d).size =
             (qsizetype)local_c8.super_QVLABase<QList<Symbol>_>.super_QVLABaseBase.ptr;
        local_c8.super_QVLABase<QList<Symbol>_>.super_QVLABaseBase.a = (qsizetype)pDVar3;
        local_c8.super_QVLABase<QList<Symbol>_>.super_QVLABaseBase.s = (qsizetype)pcVar12;
        local_c8.super_QVLABase<QList<Symbol>_>.super_QVLABaseBase.ptr = pQVar2;
        QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_c8);
        local_148.size = 0;
        local_148.d = (Data *)0x0;
        local_148.ptr = (Symbol *)0x0;
        if (local_130.isFunction == true) {
          bVar5 = false;
          do {
            bVar10 = bVar5;
            bVar6 = SymbolStack::test(symbols,PP_WHITESPACE);
            bVar5 = true;
          } while (bVar6);
          bVar5 = SymbolStack::test(symbols,LPAREN);
          if (bVar5) {
            local_c8.super_QVLABase<QList<Symbol>_>.super_QVLABaseBase.ptr =
                 &local_c8.super_QVLAStorage<24UL,_8UL,_5LL>;
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[0x70] = -0x56;
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[0x71] = -0x56;
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[0x72] = -0x56;
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[0x73] = -0x56;
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[0x74] = -0x56;
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[0x75] = -0x56;
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[0x76] = -0x56;
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[0x77] = -0x56;
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[0x60] = -0x56;
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[0x61] = -0x56;
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[0x62] = -0x56;
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[99] = -0x56;
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[100] = -0x56;
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[0x65] = -0x56;
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[0x66] = -0x56;
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[0x67] = -0x56;
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[0x68] = -0x56;
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[0x69] = -0x56;
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[0x6a] = -0x56;
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[0x6b] = -0x56;
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[0x6c] = -0x56;
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[0x6d] = -0x56;
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[0x6e] = -0x56;
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[0x6f] = -0x56;
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[0x50] = -0x56;
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[0x51] = -0x56;
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[0x52] = -0x56;
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[0x53] = -0x56;
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[0x54] = -0x56;
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[0x55] = -0x56;
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[0x56] = -0x56;
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[0x57] = -0x56;
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[0x58] = -0x56;
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[0x59] = -0x56;
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[0x5a] = -0x56;
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[0x5b] = -0x56;
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[0x5c] = -0x56;
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[0x5d] = -0x56;
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[0x5e] = -0x56;
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[0x5f] = -0x56;
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[0x40] = -0x56;
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[0x41] = -0x56;
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[0x42] = -0x56;
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[0x43] = -0x56;
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[0x44] = -0x56;
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[0x45] = -0x56;
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[0x46] = -0x56;
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[0x47] = -0x56;
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[0x48] = -0x56;
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[0x49] = -0x56;
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[0x4a] = -0x56;
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[0x4b] = -0x56;
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[0x4c] = -0x56;
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[0x4d] = -0x56;
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[0x4e] = -0x56;
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[0x4f] = -0x56;
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[0x30] = -0x56;
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[0x31] = -0x56;
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[0x32] = -0x56;
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[0x33] = -0x56;
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[0x34] = -0x56;
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[0x35] = -0x56;
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[0x36] = -0x56;
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[0x37] = -0x56;
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[0x38] = -0x56;
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[0x39] = -0x56;
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[0x3a] = -0x56;
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[0x3b] = -0x56;
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[0x3c] = -0x56;
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[0x3d] = -0x56;
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[0x3e] = -0x56;
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[0x3f] = -0x56;
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[0x20] = -0x56;
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[0x21] = -0x56;
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[0x22] = -0x56;
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[0x23] = -0x56;
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[0x24] = -0x56;
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[0x25] = -0x56;
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[0x26] = -0x56;
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[0x27] = -0x56;
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[0x28] = -0x56;
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[0x29] = -0x56;
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[0x2a] = -0x56;
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[0x2b] = -0x56;
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[0x2c] = -0x56;
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[0x2d] = -0x56;
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[0x2e] = -0x56;
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[0x2f] = -0x56;
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[0x10] = -0x56;
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[0x11] = -0x56;
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[0x12] = -0x56;
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[0x13] = -0x56;
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[0x14] = -0x56;
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[0x15] = -0x56;
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[0x16] = -0x56;
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[0x17] = -0x56;
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[0x18] = -0x56;
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[0x19] = -0x56;
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[0x1a] = -0x56;
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[0x1b] = -0x56;
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[0x1c] = -0x56;
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[0x1d] = -0x56;
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[0x1e] = -0x56;
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[0x1f] = -0x56;
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[0] = -0x56;
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[1] = -0x56;
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[2] = -0x56;
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[3] = -0x56;
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[4] = -0x56;
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[5] = -0x56;
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[6] = -0x56;
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[7] = -0x56;
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[8] = -0x56;
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[9] = -0x56;
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[10] = -0x56;
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[0xb] = -0x56;
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[0xc] = -0x56;
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[0xd] = -0x56;
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[0xe] = -0x56;
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[0xf] = -0x56;
            local_c8.super_QVLABase<QList<Symbol>_>.super_QVLABaseBase.a = 5;
            local_c8.super_QVLABase<QList<Symbol>_>.super_QVLABaseBase.s = 0;
            while (bVar5 = SymbolStack::hasNext(symbols), bVar5) {
              next.lineNum = 0;
              next.token = NOTOKEN;
              next.lex.d.d = (Data *)0x0;
              next.lex.d.ptr = (char *)0x0;
              do {
                bVar5 = SymbolStack::test(symbols,PP_WHITESPACE);
              } while (bVar5);
              iVar15 = 0;
              bVar5 = false;
              if (local_130.isVariadic == true) {
                bVar5 = (char *)local_c8.super_QVLABase<QList<Symbol>_>.super_QVLABaseBase.s ==
                        (char *)(local_130.arguments.d.size + -1);
              }
              while (bVar6 = SymbolStack::hasNext(symbols), iVar14 = iVar15, bVar6) {
                TVar7 = SymbolStack::next(symbols);
                if (TVar7 == PP_RPAREN) {
                  iVar14 = iVar15 + -1;
                  bVar6 = iVar15 < 1;
                  iVar15 = iVar14;
                  if (bVar6) break;
                }
                else if (TVar7 == LPAREN) {
                  iVar15 = iVar15 + 1;
                }
                else if (!(bool)((TVar7 != COMMA || iVar15 != 0) | bVar5)) {
                  iVar14 = 0;
                  break;
                }
                pSVar1 = (symbols->super_QStack<SafeSymbols>).super_QList<SafeSymbols>.d.ptr;
                lVar11 = (symbols->super_QStack<SafeSymbols>).super_QList<SafeSymbols>.d.size;
                QList<Symbol>::emplaceBack<Symbol_const&>
                          ((QList<Symbol> *)&next,
                           pSVar1[lVar11 + -1].symbols.d.ptr + pSVar1[lVar11 + -1].index + -1);
              }
              QVarLengthArray<QList<Symbol>,_5LL>::append(&local_c8,(QList<Symbol> *)&next);
              if (iVar14 < 0) {
                QArrayDataPointer<Symbol>::~QArrayDataPointer((QArrayDataPointer<Symbol> *)&next);
                break;
              }
              bVar5 = SymbolStack::hasNext(symbols);
              if (!bVar5) {
                pcVar12 = "missing \')\' in macro usage";
                goto LAB_00129320;
              }
              QArrayDataPointer<Symbol>::~QArrayDataPointer((QArrayDataPointer<Symbol> *)&next);
            }
            if ((local_130.isVariadic == true) &&
               ((char *)local_c8.super_QVLABase<QList<Symbol>_>.super_QVLABaseBase.s ==
                (char *)(local_130.arguments.d.size + -1))) {
              next.lineNum = 0;
              next.token = NOTOKEN;
              next.lex.d.d = (Data *)0x0;
              next.lex.d.ptr = (char *)0x0;
              QVarLengthArray<QList<Symbol>,5ll>::emplace_back<QList<Symbol>>
                        ((QVarLengthArray<QList<Symbol>,5ll> *)&local_c8,(QList<Symbol> *)&next);
              QArrayDataPointer<Symbol>::~QArrayDataPointer((QArrayDataPointer<Symbol> *)&next);
            }
            cVar13 = '\0';
            for (pSVar16 = local_130.symbols.d.ptr;
                pSVar16 != local_130.symbols.d.ptr + local_130.symbols.d.size; pSVar16 = pSVar16 + 1
                ) {
              TVar7 = pSVar16->token;
              if ((TVar7 == PP_HASHHASH) || (TVar7 == HASH)) {
                cVar13 = (TVar7 != HASH) + '\x01';
              }
              else {
                qVar9 = QtPrivate::indexOf<Symbol,Symbol>(&local_130.arguments,pSVar16,0);
                if (cVar13 == '\x01') {
                  if (qVar9 < 0) {
                    pcVar12 = "\'#\' is not followed by a macro parameter";
                    goto LAB_00129320;
                  }
                  if (local_c8.super_QVLABase<QList<Symbol>_>.super_QVLABaseBase.s <= qVar9) {
                    pcVar12 = "Macro invoked with too few parameters for a use of \'#\'";
                    goto LAB_00129320;
                  }
                  QStack_1a0.ptr = (char *)0x0;
                  idx = 0;
                  QStack_1a0.d = (Data *)0x0;
                  this = *(Symbol **)
                          ((char *)local_c8.super_QVLABase<QList<Symbol>_>.super_QVLABaseBase.ptr +
                          qVar9 * 0x18 + 8);
                  for (lVar11 = *(long *)((char *)local_c8.super_QVLABase<QList<Symbol>_>.
                                                  super_QVLABaseBase.ptr + qVar9 * 0x18 + 0x10) *
                                0x30; lVar11 != 0; lVar11 = lVar11 + -0x30) {
                    Symbol::lexem((QByteArray *)&next,this);
                    QByteArray::append((QByteArray *)&idx);
                    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&next);
                    this = this + 1;
                  }
                  qVar9 = QByteArrayView::lengthHelperCharArray("\\\"",3);
                  after.m_data = "\\\"";
                  after.m_size = qVar9;
                  QByteArray::replace((QByteArray *)&idx,'\"',after);
                  QByteArray::prepend((QByteArray *)&idx,'\"');
                  QByteArray::append((char)(QArrayDataPointer<char> *)&idx);
                  Symbol::Symbol(&next,lineNum,PP_STRING_LITERAL,(QByteArray *)&idx);
                  QList<Symbol>::emplaceBack<Symbol>((QList<Symbol> *)&local_148,&next);
                  QArrayDataPointer<char>::~QArrayDataPointer(&next.lex.d);
                  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&idx);
                }
                else if (cVar13 == '\0') {
                  if ((qVar9 < 0) ||
                     (local_c8.super_QVLABase<QList<Symbol>_>.super_QVLABaseBase.s <= qVar9)) {
                    QList<Symbol>::emplaceBack<Symbol_const&>((QList<Symbol> *)&local_148,pSVar16);
                  }
                  else if ((pSVar16 ==
                            local_130.symbols.d.ptr + local_130.symbols.d.size +
                            -(ulong)(local_130.symbols.d.size != 0)) ||
                          (pSVar16[1].token != PP_HASHHASH)) {
                    lVar11 = qVar9 * 0x18;
                    next._0_8_ = *(undefined8 *)
                                  ((char *)local_c8.super_QVLABase<QList<Symbol>_>.
                                           super_QVLABaseBase.ptr + lVar11);
                    next.lex.d.d = *(Data **)((char *)local_c8.super_QVLABase<QList<Symbol>_>.
                                                      super_QVLABaseBase.ptr + lVar11 + 8);
                    next.lex.d.ptr =
                         *(char **)((char *)local_c8.super_QVLABase<QList<Symbol>_>.
                                            super_QVLABaseBase.ptr + lVar11 + 0x10);
                    if ((int *)next._0_8_ != (int *)0x0) {
                      LOCK();
                      *(int *)next._0_8_ = *(int *)next._0_8_ + 1;
                      UNLOCK();
                    }
                    idx = 1;
                    SymbolStack::excludeSymbols((SymbolStack *)&local_1f8);
                    macroExpand((Symbols *)&local_148,that,(Symbols *)&next,&idx,lineNum,false,
                                (QSet<QByteArray> *)&local_1f8);
                    QHash<QByteArray,_QHashDummyValue>::~QHash
                              ((QHash<QByteArray,_QHashDummyValue> *)&local_1f8);
                    QArrayDataPointer<Symbol>::~QArrayDataPointer
                              ((QArrayDataPointer<Symbol> *)&next);
                  }
                  else {
                    QList<Symbol>::append
                              ((QList<Symbol> *)&local_148,
                               (QList<Symbol> *)
                               ((char *)local_c8.super_QVLABase<QList<Symbol>_>.super_QVLABaseBase.
                                        ptr + qVar9 * 0x18));
                  }
                }
                else {
                  cVar13 = '\x02';
                  if (pSVar16->token == PP_WHITESPACE) goto LAB_0012923b;
                  while ((local_148.size != 0 &&
                         (local_148.ptr[local_148.size + -1].token == PP_WHITESPACE))) {
                    QList<Symbol>::removeLast((QList<Symbol> *)&local_148);
                  }
                  next.from = -0x5555555555555556;
                  next.len = -0x5555555555555556;
                  next.lex.d.ptr = (char *)0xaaaaaaaaaaaaaaaa;
                  next.lex.d.size = -0x5555555555555556;
                  next.lineNum = -0x55555556;
                  next.token = 0xaaaaaaaa;
                  next.lex.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
                  Symbol::Symbol(&next,pSVar16);
                  if ((qVar9 < 0) ||
                     (local_c8.super_QVLABase<QList<Symbol>_>.super_QVLABaseBase.s <= qVar9)) {
LAB_00129043:
                    if (((local_148.size == 0) ||
                        (local_148.ptr[local_148.size + -1].token == PP_STRING_LITERAL)) ||
                       (local_148.ptr[local_148.size + -1].token != pSVar16->token)) {
                      QList<Symbol>::emplaceBack<Symbol_const&>((QList<Symbol> *)&local_148,&next);
                    }
                    else {
                      local_188 = -0x5555555555555556;
                      qStack_180 = -0x5555555555555556;
                      QStack_1a0.ptr = (char *)0xaaaaaaaaaaaaaaaa;
                      QStack_1a0.size = -0x5555555555555556;
                      idx = -0x5555555555555556;
                      QStack_1a0.d = (Data *)0xaaaaaaaaaaaaaaaa;
                      QList<Symbol>::takeLast((value_type *)&idx,(QList<Symbol> *)&local_148);
                      local_1c8.size = -0x5555555555555556;
                      local_1c8.d = (Data *)0xaaaaaaaaaaaaaaaa;
                      local_1c8.ptr = (char *)0xaaaaaaaaaaaaaaaa;
                      Symbol::lexem((QByteArray *)&local_210,(value_type *)&idx);
                      Symbol::lexem((QByteArray *)&local_228,&next);
                      QStringBuilder<QByteArray,_QByteArray>::QStringBuilder
                                ((QStringBuilder<QByteArray,_QByteArray> *)&local_1f8,
                                 (QByteArray *)&local_210,(QByteArray *)&local_228);
                      QStringBuilder<QByteArray,_QByteArray>::convertTo<QByteArray>
                                ((QByteArray *)&local_1c8,
                                 (QStringBuilder<QByteArray,_QByteArray> *)&local_1f8);
                      QStringBuilder<QByteArray,_QByteArray>::~QStringBuilder
                                ((QStringBuilder<QByteArray,_QByteArray> *)&local_1f8);
                      QArrayDataPointer<char>::~QArrayDataPointer(&local_228);
                      QArrayDataPointer<char>::~QArrayDataPointer(&local_210);
                      Symbol::Symbol(&local_1f8,lineNum,idx._4_4_,(QByteArray *)&local_1c8);
                      QList<Symbol>::emplaceBack<Symbol>((QList<Symbol> *)&local_148,&local_1f8);
                      QArrayDataPointer<char>::~QArrayDataPointer(&local_1f8.lex.d);
                      QArrayDataPointer<char>::~QArrayDataPointer(&local_1c8);
                      QArrayDataPointer<char>::~QArrayDataPointer(&QStack_1a0);
                    }
                    if ((-1 < qVar9) &&
                       (qVar9 < local_c8.super_QVLABase<QList<Symbol>_>.super_QVLABaseBase.s)) {
                      if (*(long *)((char *)local_c8.super_QVLABase<QList<Symbol>_>.
                                            super_QVLABaseBase.ptr + qVar9 * 0x18 + 0x10) != 0) {
                        QtPrivate::QCommonArrayOps<Symbol>::growAppend
                                  ((QCommonArrayOps<Symbol> *)&local_148,
                                   (Symbol *)
                                   (*(long *)((char *)local_c8.super_QVLABase<QList<Symbol>_>.
                                                      super_QVLABaseBase.ptr + qVar9 * 0x18 + 8) +
                                   0x30),(Symbol *)
                                         (*(long *)((char *)local_c8.super_QVLABase<QList<Symbol>_>.
                                                            super_QVLABaseBase.ptr +
                                                   qVar9 * 0x18 + 0x10) * 0x30 +
                                         *(long *)((char *)local_c8.super_QVLABase<QList<Symbol>_>.
                                                           super_QVLABaseBase.ptr + qVar9 * 0x18 + 8
                                                  )));
                      }
                    }
                    cVar13 = '\x02';
                    bVar5 = true;
                  }
                  else {
                    if (*(long *)((char *)local_c8.super_QVLABase<QList<Symbol>_>.super_QVLABaseBase
                                          .ptr + qVar9 * 0x18 + 0x10) != 0) {
                      Symbol::operator=(&next,*(Symbol **)
                                               ((char *)local_c8.super_QVLABase<QList<Symbol>_>.
                                                        super_QVLABaseBase.ptr + qVar9 * 0x18 + 8));
                      goto LAB_00129043;
                    }
                    cVar13 = '\0';
                    bVar5 = false;
                  }
                  QArrayDataPointer<char>::~QArrayDataPointer(&next.lex.d);
                  if (!bVar5) goto LAB_0012923b;
                }
                cVar13 = '\0';
              }
LAB_0012923b:
            }
            if (cVar13 != '\0') {
              pcVar12 = "\'#\' or \'##\' found at the end of a macro argument";
LAB_00129320:
              Parser::error(&that->super_Parser,pcVar12);
            }
            QVarLengthArray<QList<Symbol>,_5LL>::~QVarLengthArray(&local_c8);
            goto LAB_001292ca;
          }
          local_c8.super_QVLABase<QList<Symbol>_>.super_QVLABaseBase.a = (qsizetype)(macroName->d).d
          ;
          local_c8.super_QVLABase<QList<Symbol>_>.super_QVLABaseBase.s =
               (qsizetype)(macroName->d).ptr;
          (macroName->d).d = (Data *)0x0;
          (macroName->d).ptr = (char *)0x0;
          local_c8.super_QVLABase<QList<Symbol>_>.super_QVLABaseBase.ptr =
               (void *)(macroName->d).size;
          (macroName->d).size = 0;
          QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_c8);
          (__return_storage_ptr__->d).d = (Data *)0x0;
          (__return_storage_ptr__->d).ptr = (Symbol *)0x0;
          (__return_storage_ptr__->d).size = 0;
          if (bVar10) {
            local_c8.super_QVLABase<QList<Symbol>_>.super_QVLABaseBase.a = CONCAT44(0xa5,lineNum);
            local_c8.super_QVLABase<QList<Symbol>_>.super_QVLABaseBase.s = 0;
            local_c8.super_QVLABase<QList<Symbol>_>.super_QVLABaseBase.ptr =
                 (QVLAStorage<24UL,_8UL,_5LL> *)0x0;
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[0] = '\0';
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[1] = '\0';
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[2] = '\0';
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[3] = '\0';
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[4] = '\0';
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[5] = '\0';
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[6] = '\0';
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[7] = '\0';
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[8] = '\0';
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[9] = '\0';
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[10] = '\0';
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[0xb] = '\0';
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[0xc] = '\0';
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[0xd] = '\0';
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[0xe] = '\0';
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[0xf] = '\0';
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[0x10] = -1;
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[0x11] = -1;
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[0x12] = -1;
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[0x13] = -1;
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[0x14] = -1;
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[0x15] = -1;
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[0x16] = -1;
            local_c8.super_QVLAStorage<24UL,_8UL,_5LL>.array[0x17] = -1;
            QList<Symbol>::emplaceBack<Symbol>(__return_storage_ptr__,(Symbol *)&local_c8);
            QArrayDataPointer<char>::~QArrayDataPointer
                      ((QArrayDataPointer<char> *)
                       &local_c8.super_QVLABase<QList<Symbol>_>.super_QVLABaseBase.s);
          }
          QList<Symbol>::emplaceBack<Symbol_const&>(__return_storage_ptr__,&s);
          iVar8 = QList<Symbol>::end(__return_storage_ptr__);
          iVar8.i[-1].lineNum = lineNum;
        }
        else {
          QArrayDataPointer<Symbol>::operator=(&local_148,&local_130.symbols.d);
LAB_001292ca:
          qVar9 = local_148.size;
          pSVar16 = local_148.ptr;
          pDVar4 = local_148.d;
          local_148.d = (Data *)0x0;
          local_148.ptr = (Symbol *)0x0;
          (__return_storage_ptr__->d).d = pDVar4;
          (__return_storage_ptr__->d).ptr = pSVar16;
          local_148.size = 0;
          (__return_storage_ptr__->d).size = qVar9;
        }
        QArrayDataPointer<Symbol>::~QArrayDataPointer(&local_148);
        Macro::~Macro(&local_130);
        goto LAB_00128c58;
      }
    }
    else {
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_c8);
    }
  }
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (Symbol *)0x0;
  (__return_storage_ptr__->d).size = 0;
LAB_00128c58:
  QArrayDataPointer<char>::~QArrayDataPointer(&s.lex.d);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

Symbols Preprocessor::macroExpandIdentifier(Preprocessor *that, SymbolStack &symbols, int lineNum, QByteArray *macroName)
{
    Symbol s = symbols.symbol();

    // not a macro
    if (s.token != PP_IDENTIFIER || !that->macros.contains(s) || symbols.dontReplaceSymbol(s.lexem())) {
        return Symbols();
    }

    const Macro &macro = that->macros.value(s);
    *macroName = s.lexem();

    Symbols expansion;
    if (!macro.isFunction) {
        expansion = macro.symbols;
    } else {
        bool haveSpace = false;
        while (symbols.test(PP_WHITESPACE)) { haveSpace = true; }
        if (!symbols.test(PP_LPAREN)) {
            *macroName = QByteArray();
            Symbols syms;
            if (haveSpace)
                syms += Symbol(lineNum, PP_WHITESPACE);
            syms += s;
            syms.last().lineNum = lineNum;
            return syms;
        }
        QVarLengthArray<Symbols, 5> arguments;
        while (symbols.hasNext()) {
            Symbols argument;
            // strip leading space
            while (symbols.test(PP_WHITESPACE)) {}
            int nesting = 0;
            bool vararg = macro.isVariadic && (arguments.size() == macro.arguments.size() - 1);
            while (symbols.hasNext()) {
                Token t = symbols.next();
                if (t == PP_LPAREN) {
                    ++nesting;
                } else if (t == PP_RPAREN) {
                    --nesting;
                    if (nesting < 0)
                        break;
                } else if (t == PP_COMMA && nesting == 0) {
                    if (!vararg)
                        break;
                }
                argument += symbols.symbol();
            }
            arguments += argument;

            if (nesting < 0)
                break;
            else if (!symbols.hasNext())
                that->error("missing ')' in macro usage");
        }

        // empty VA_ARGS
        if (macro.isVariadic && arguments.size() == macro.arguments.size() - 1)
            arguments += Symbols();

        // now replace the macro arguments with the expanded arguments
        enum Mode {
            Normal,
            Hash,
            HashHash
        } mode = Normal;

        const auto end = macro.symbols.cend();
        auto it = macro.symbols.cbegin();
        const auto lastSym = std::prev(macro.symbols.cend(), !macro.symbols.isEmpty() ? 1 : 0);
        for (; it != end; ++it) {
            const Symbol &s = *it;
            if (s.token == HASH || s.token == PP_HASHHASH) {
                mode = (s.token == HASH ? Hash : HashHash);
                continue;
            }
            const qsizetype index = macro.arguments.indexOf(s);
            if (mode == Normal) {
                if (index >= 0 && index < arguments.size()) {
                    // each argument undoergoes macro expansion if it's not used as part of a # or ##
                    if (it == lastSym || std::next(it)->token != PP_HASHHASH) {
                        Symbols arg = arguments.at(index);
                        qsizetype idx = 1;
                        macroExpand(&expansion, that, arg, idx, lineNum, false, symbols.excludeSymbols());
                    } else {
                        expansion += arguments.at(index);
                    }
               } else {
                    expansion += s;
                }
            } else if (mode == Hash) {
                if (index < 0) {
                    that->error("'#' is not followed by a macro parameter");
                    continue;
                } else if (index >= arguments.size()) {
                    that->error("Macro invoked with too few parameters for a use of '#'");
                    continue;
                }

                const Symbols &arg = arguments.at(index);
                QByteArray stringified;
                for (const Symbol &sym : arg)
                    stringified += sym.lexem();

                stringified.replace('"', "\\\"");
                stringified.prepend('"');
                stringified.append('"');
                expansion += Symbol(lineNum, STRING_LITERAL, stringified);
            } else if (mode == HashHash){
                if (s.token == WHITESPACE)
                    continue;

                while (expansion.size() && expansion.constLast().token == PP_WHITESPACE)
                    expansion.pop_back();

                Symbol next = s;
                if (index >= 0 && index < arguments.size()) {
                    const Symbols &arg = arguments.at(index);
                    if (arg.size() == 0) {
                        mode = Normal;
                        continue;
                    }
                    next = arg.at(0);
                }

                if (!expansion.isEmpty() && expansion.constLast().token == s.token
                    && expansion.constLast().token != STRING_LITERAL) {
                    Symbol last = expansion.takeLast();

                    QByteArray lexem = last.lexem() + next.lexem();
                    expansion += Symbol(lineNum, last.token, lexem);
                } else {
                    expansion += next;
                }

                if (index >= 0 && index < arguments.size()) {
                    const Symbols &arg = arguments.at(index);
                    if (!arg.isEmpty())
                        expansion.append(arg.cbegin() + 1, arg.cend());
                }
            }
            mode = Normal;
        }
        if (mode != Normal)
            that->error("'#' or '##' found at the end of a macro argument");

    }

    return expansion;
}